

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

int store_oprnd(dill_stream c,int tmp_num,int vreg)

{
  int iVar1;
  int iVar2;
  
  iVar1 = offset_of(c,tmp_num);
  iVar2 = dill_type_of(c,tmp_num);
  iVar1 = (*c->j->storei)(c,iVar2,0,c->p->v_tmps[iVar2][0],(&c->dill_local_pointer)[tmp_num < 100],
                          (long)iVar1);
  return iVar1;
}

Assistant:

static int
store_oprnd(dill_stream c, int tmp_num, int vreg)
{
    int offset = offset_of(c, vreg);
    int typ = dill_type_of(c, vreg);
    int tmp = c->p->v_tmps[typ][tmp_num];
    if (vreg >= 100) {
        c->j->storei(c, typ, 0, tmp, c->dill_local_pointer, offset);
    } else {
        c->j->storei(c, typ, 0, tmp, c->dill_param_reg_pointer, offset);
    }
    return tmp;
}